

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_interpolation.c
# Opt level: O3

double filter_catmullrom(double x)

{
  double dVar1;
  
  if (x < -2.0) {
    return 0.0;
  }
  if (-1.0 <= x) {
    if (0.0 <= x) {
      if (1.0 <= x) {
        if (2.0 <= x) {
          return 0.0;
        }
        dVar1 = (5.0 - x) * x + -8.0;
        goto LAB_0011da5b;
      }
      dVar1 = x * 3.0;
    }
    else {
      dVar1 = x * -3.0;
    }
    dVar1 = (dVar1 + -5.0) * x * x + 2.0;
  }
  else {
    dVar1 = (x + 5.0) * x + 8.0;
LAB_0011da5b:
    dVar1 = dVar1 * x + 4.0;
  }
  return dVar1 * 0.5;
}

Assistant:

static double filter_catmullrom(const double x)
{
	if (x < -2.0)
		return(0.0f);
	if (x < -1.0)
		return(0.5f*(4.0f+x*(8.0f+x*(5.0f+x))));
	if (x < 0.0)
		return(0.5f*(2.0f+x*x*(-5.0f-3.0f*x)));
	if (x < 1.0)
		return(0.5f*(2.0f+x*x*(-5.0f+3.0f*x)));
	if (x < 2.0)
		return(0.5f*(4.0f+x*(-8.0f+x*(5.0f-x))));
	return(0.0f);
}